

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBoxShape.cpp
# Opt level: O2

void __thiscall chrono::ChBoxShape::ArchiveIN(ChBoxShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChBox> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChBoxShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gbox;
  local_28._name = "gbox";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChBoxShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBoxShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gbox);
}